

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

bool QtPrivate::QTypeNormalizer::skipToken(char **x,char *e,char *token,bool msvcKw)

{
  char cVar1;
  bool bVar2;
  byte *pbVar3;
  char *pcVar4;
  
  bVar2 = starts_with_token(*x,e,token,msvcKw);
  if (bVar2) {
    pbVar3 = (byte *)*x;
    if (*token != '\0') {
      pcVar4 = token + 1;
      do {
        pbVar3 = pbVar3 + 1;
        *x = (char *)pbVar3;
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
    }
    while (((pbVar3 != (byte *)e && ((ulong)*pbVar3 < 0x21)) &&
           ((0x100000600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
      pbVar3 = pbVar3 + 1;
      *x = (char *)pbVar3;
    }
  }
  return bVar2;
}

Assistant:

static constexpr bool skipToken(const char *&x, const char *e, const char *token,
                                    bool msvcKw = false)
    {
        if (!starts_with_token(x, e, token, msvcKw))
            return false;
        while (*token++)
            x++;
        while (x != e && is_space(*x))
            x++;
        return true;
    }